

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O3

Mat * __thiscall ncnn::Mat::operator=(Mat *this,Mat *m)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  if (this != m) {
    piVar1 = m->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = this->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (this->allocator == (Allocator *)0x0) {
          if (this->data != (void *)0x0) {
            free(this->data);
          }
        }
        else {
          (**(code **)(*(long *)this->allocator + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&this->refcount + 4) = 0;
    *(undefined8 *)((long)&this->elemsize + 4) = 0;
    this->data = (void *)0x0;
    this->refcount = (int *)0x0;
    this->dims = 0;
    this->w = 0;
    this->h = 0;
    this->c = 0;
    this->cstep = 0;
    piVar1 = m->refcount;
    this->data = m->data;
    this->refcount = piVar1;
    this->elemsize = m->elemsize;
    this->elempack = m->elempack;
    this->allocator = m->allocator;
    iVar2 = m->w;
    iVar3 = m->h;
    iVar4 = m->c;
    this->dims = m->dims;
    this->w = iVar2;
    this->h = iVar3;
    this->c = iVar4;
    this->cstep = m->cstep;
  }
  return this;
}

Assistant:

inline Mat& Mat::operator=(const Mat& m)
{
    if (this == &m)
        return *this;

    if (m.refcount)
        NCNN_XADD(m.refcount, 1);

    release();

    data = m.data;
    refcount = m.refcount;
    elemsize = m.elemsize;
    elempack = m.elempack;
    allocator = m.allocator;

    dims = m.dims;
    w = m.w;
    h = m.h;
    c = m.c;

    cstep = m.cstep;

    return *this;
}